

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O3

internal_exr_unpack_fn
internal_exr_match_decode
          (exr_decode_pipeline_t *decode,int isdeep,int chanstofill,int chanstounpack,int sametype,
          int sameouttype,int samebpc,int sameoutbpc,int hassampling,int hastypechange,
          int sameoutinc,int simpinterleave,int simpinterleaverev,int simplineoff)

{
  short sVar1;
  int *piVar2;
  long lVar3;
  internal_exr_unpack_fn p_Var4;
  code *pcVar5;
  uint in_XCR0;
  
  if (internal_exr_match_decode::init_cpu_check != 0) {
    piVar2 = (int *)cpuid_basic_info(0);
    if (*piVar2 != 0) {
      lVar3 = cpuid_Version_info(1);
      if ((((*(uint *)(lVar3 + 0xc) >> 0x1b & 1) != 0) &&
          ((~*(uint *)(lVar3 + 0xc) & 0x30000000) == 0)) && ((in_XCR0 & 6) == 6)) {
        half_to_float_buffer = half_to_float_buffer_f16c;
      }
    }
    LOCK();
    internal_exr_match_decode::init_cpu_check = 0;
    UNLOCK();
  }
  if (isdeep != 0) {
    if ((decode->decode_flags & 2) != 0) {
      return generic_unpack_deep_pointers;
    }
    return generic_unpack_deep;
  }
  if (hastypechange < 1) {
    if (hassampling != 0) {
      return generic_unpack;
    }
    if (sameoutbpc < 1) {
      return generic_unpack;
    }
    if (samebpc < 1) {
      return generic_unpack;
    }
    sVar1 = decode->channel_count;
    if (sVar1 != chanstofill) {
      return generic_unpack;
    }
    if (samebpc == 4) {
      return unpack_32bit;
    }
    if (samebpc != 2) {
      return generic_unpack;
    }
    if (0 < simpinterleave) {
      if (sVar1 == 4) {
        return unpack_16bit_4chan_interleave;
      }
      if (sVar1 == 3) {
        return unpack_16bit_3chan_interleave;
      }
    }
    if (0 < simpinterleaverev) {
      if (sVar1 == 4) {
        return unpack_16bit_4chan_interleave_rev;
      }
      if (sVar1 == 3) {
        return unpack_16bit_3chan_interleave_rev;
      }
    }
    if (sameoutinc == 2) {
      if (sVar1 == 4) {
        return unpack_16bit_4chan_planar;
      }
      if (sVar1 == 3) {
        return unpack_16bit_3chan_planar;
      }
    }
    pcVar5 = unpack_16bit;
    if (sVar1 == 3) {
      pcVar5 = unpack_16bit_3chan;
    }
    if (sVar1 == 4) {
      return unpack_16bit_4chan;
    }
    return pcVar5;
  }
  if (hassampling != 0) {
    return generic_unpack;
  }
  if (sameouttype != 2) {
    return generic_unpack;
  }
  if (sametype != 1) {
    return generic_unpack;
  }
  sVar1 = decode->channel_count;
  if (sVar1 == chanstofill) {
    if (0 < simpinterleave) {
      if (sVar1 == 4) {
        return unpack_half_to_float_4chan_interleave;
      }
      if (sVar1 == 3) {
        return unpack_half_to_float_3chan_interleave;
      }
    }
    if (0 < simpinterleaverev) {
      if (sVar1 == 4) {
        return unpack_half_to_float_4chan_interleave_rev;
      }
      if (sVar1 == 3) {
        return unpack_half_to_float_3chan_interleave_rev;
      }
    }
    p_Var4 = generic_unpack;
    if (sameoutinc == 4) {
      pcVar5 = generic_unpack;
      if (sVar1 == 3) {
        pcVar5 = unpack_half_to_float_3chan_planar;
      }
      p_Var4 = unpack_half_to_float_4chan_planar;
      if (sVar1 != 4) {
        p_Var4 = pcVar5;
      }
    }
    return p_Var4;
  }
  return generic_unpack;
}

Assistant:

internal_exr_unpack_fn
internal_exr_match_decode (
    exr_decode_pipeline_t* decode,
    int                    isdeep,
    int                    chanstofill,
    int                    chanstounpack,
    int                    sametype,
    int                    sameouttype,
    int                    samebpc,
    int                    sameoutbpc,
    int                    hassampling,
    int                    hastypechange,
    int                    sameoutinc,
    int                    simpinterleave,
    int                    simpinterleaverev,
    int                    simplineoff)
{
#ifdef EXR_HAS_STD_ATOMICS
    static atomic_int init_cpu_check = 1;
#else
    static int init_cpu_check = 1;
#endif
    if (init_cpu_check)
    {
        choose_half_to_float_impl ();
        init_cpu_check = 0;
    }

    if (isdeep)
    {
        if ((decode->decode_flags & EXR_DECODE_NON_IMAGE_DATA_AS_POINTERS))
            return &generic_unpack_deep_pointers;
        return &generic_unpack_deep;
    }

    if (hastypechange > 0)
    {
        /* other optimizations would not be difficult, but this will
         * be the common one (where on encode / pack we want to do the
         * opposite) */
        if (!hassampling &&
            chanstofill == decode->channel_count &&
            sametype == (int) EXR_PIXEL_HALF &&
            sameouttype == (int) EXR_PIXEL_FLOAT)
        {
            if (simpinterleave > 0)
            {
                if (decode->channel_count == 4)
                    return &unpack_half_to_float_4chan_interleave;
                if (decode->channel_count == 3)
                    return &unpack_half_to_float_3chan_interleave;
            }

            if (simpinterleaverev > 0)
            {
                if (decode->channel_count == 4)
                    return &unpack_half_to_float_4chan_interleave_rev;
                if (decode->channel_count == 3)
                    return &unpack_half_to_float_3chan_interleave_rev;
            }

            if (sameoutinc == 4)
            {
                if (decode->channel_count == 4)
                    return &unpack_half_to_float_4chan_planar;
                if (decode->channel_count == 3)
                    return &unpack_half_to_float_3chan_planar;
            }
        }

        return &generic_unpack;
    }

    if (hassampling || chanstofill != decode->channel_count || samebpc <= 0 ||
        sameoutbpc <= 0)
        return &generic_unpack;

    (void) chanstounpack;
    (void) simplineoff;

    if (samebpc == 2)
    {
        if (simpinterleave > 0)
        {
            if (decode->channel_count == 4)
                return &unpack_16bit_4chan_interleave;
            if (decode->channel_count == 3)
                return &unpack_16bit_3chan_interleave;
        }

        if (simpinterleaverev > 0)
        {
            if (decode->channel_count == 4)
                return &unpack_16bit_4chan_interleave_rev;
            if (decode->channel_count == 3)
                return &unpack_16bit_3chan_interleave_rev;
        }

        if (sameoutinc == 2)
        {
            if (decode->channel_count == 4) return &unpack_16bit_4chan_planar;
            if (decode->channel_count == 3) return &unpack_16bit_3chan_planar;
        }

        if (decode->channel_count == 4) return &unpack_16bit_4chan;
        if (decode->channel_count == 3) return &unpack_16bit_3chan;

        return &unpack_16bit;
    }

    if (samebpc == 4)
    {
        //if (decode->channel_count == 4) return &unpack_32bit_4chan;
        //if (decode->channel_count == 3) return &unpack_32bit_3chan;
        return &unpack_32bit;
    }

    return &generic_unpack;
}